

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeStructResultType(Builder *this,Id type0,Id type1)

{
  int iVar1;
  Id IVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  reference ppIVar5;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> members;
  key_type local_30;
  int local_2c;
  Instruction *pIStack_28;
  int t;
  Instruction *type;
  Id type1_local;
  Id type0_local;
  Builder *this_local;
  
  local_2c = 0;
  type._0_4_ = type1;
  type._4_4_ = type0;
  _type1_local = this;
  while( true ) {
    iVar1 = local_2c;
    local_30 = 0x1e;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,&stack0xffffffffffffffd0);
    sVar4 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar3);
    if ((int)sVar4 <= iVar1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                 (value_type *)((long)&type + 4));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,(value_type *)&type
                );
      this_local._4_4_ =
           makeStructType(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                          "ResType",true);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      return this_local._4_4_;
    }
    members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0x1e;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,
                          (key_type *)
                          ((long)&members.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    ppIVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar3,(long)local_2c);
    pIStack_28 = *ppIVar5;
    iVar1 = spv::Instruction::getNumOperands(pIStack_28);
    if (((iVar1 == 2) && (IVar2 = spv::Instruction::getIdOperand(pIStack_28,0), IVar2 == type._4_4_)
        ) && (IVar2 = spv::Instruction::getIdOperand(pIStack_28,1), IVar2 == (Id)type)) break;
    local_2c = local_2c + 1;
  }
  IVar2 = spv::Instruction::getResultId(pIStack_28);
  return IVar2;
}

Assistant:

Id Builder::makeStructResultType(Id type0, Id type1)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeStruct].size(); ++t) {
        type = groupedTypes[OpTypeStruct][t];
        if (type->getNumOperands() != 2)
            continue;
        if (type->getIdOperand(0) != type0 ||
            type->getIdOperand(1) != type1)
            continue;
        return type->getResultId();
    }

    // not found, make it
    std::vector<spv::Id> members;
    members.push_back(type0);
    members.push_back(type1);

    return makeStructType(members, "ResType");
}